

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void hash_table_clear(hash_table_t *table)

{
  uint uVar1;
  hash_table_bucket_t *phVar2;
  hash_table_bucket_t *phVar3;
  ulong uVar4;
  hash_table_bucket_t *phVar5;
  
  uVar1 = table->n_buckets;
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    phVar2 = table->buckets;
    phVar5 = phVar2[uVar4].next;
    while (phVar5 != (hash_table_bucket_t *)0x0) {
      phVar3 = phVar5->next;
      phVar5->next = table->free_buckets;
      phVar5->data = (void *)0x0;
      table->free_buckets = phVar5;
      phVar5 = phVar3;
    }
    phVar2 = phVar2 + uVar4;
    phVar2->data = (void *)0x0;
    phVar2->next = (hash_table_bucket_t *)0x0;
  }
  table->n_items = 0;
  return;
}

Assistant:

void hash_table_clear( hash_table_t * table )
{
    unsigned i;
    /* return all blocks to the free list */
    for ( i = 0; i < table->n_buckets; ++i ) {
        hash_table_bucket_t *c, * b = table->buckets[i].next;
        while (b) {
           c = b->next;
           b->next = table->free_buckets;
           b->data = NULL;
           table->free_buckets = b;
           b = c; 
        }
        table->buckets[i].next = NULL;
        table->buckets[i].data = NULL;
    }
    table->n_items = 0;
}